

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11EglPlatform.cpp
# Opt level: O0

void __thiscall
tcu::x11::egl::Display::Display
          (Display *this,
          MovePtr<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_> *x11Display)

{
  PtrData<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_> data;
  UniquePtr<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_> *this_00;
  MovePtr *this_01;
  MovePtr<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_> *x11Display_local;
  Display *this_local;
  
  this_01 = (MovePtr *)0x3;
  eglu::NativeDisplay::NativeDisplay
            (&this->super_NativeDisplay,
             CAPABILITY_GET_DISPLAY_PLATFORM|CAPABILITY_GET_DISPLAY_LEGACY,0x31d5,
             "EGL_EXT_platform_x11");
  (this->super_NativeDisplay)._vptr_NativeDisplay = (_func_int **)&PTR__Display_00ca1678;
  this_00 = &this->m_display;
  de::details::MovePtr::operator_cast_to_PtrData
            ((PtrData<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_> *)
             x11Display,this_01);
  data._8_8_ = x11Display;
  data.ptr = (XlibDisplay *)this;
  de::details::UniquePtr<tcu::x11::XlibDisplay,_de::DefaultDeleter<tcu::x11::XlibDisplay>_>::
  UniquePtr(this_00,data);
  Library::Library(&this->m_library);
  return;
}

Assistant:

Display				(MovePtr<XlibDisplay> x11Display)
									: NativeDisplay	(CAPABILITIES,
													 EGL_PLATFORM_X11_EXT,
													 "EGL_EXT_platform_x11")
									, m_display		(x11Display) {}